

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int mac_ctrl_magma(EVP_PKEY *pkey,int op,long arg1,void *arg2)

{
  void *arg2_local;
  long arg1_local;
  int op_local;
  EVP_PKEY *pkey_local;
  int local_4;
  
  if ((op == 3) && (arg2 != (void *)0x0)) {
    *(undefined4 *)arg2 = 0x4a8;
    local_4 = 2;
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

static int mac_ctrl_magma(EVP_PKEY *pkey, int op, long arg1, void *arg2)
{
    switch (op) {
    case ASN1_PKEY_CTRL_DEFAULT_MD_NID:
        if (arg2) {
            *(int *)arg2 = NID_magma_mac;
            return 2;
        }
    }
    return -2;
}